

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color3f *value)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_2c [8];
  float3 v;
  color3f *value_local;
  AsciiParser *this_local;
  
  v._M_elems._4_8_ = value;
  bVar1 = ParseBasicTypeTuple<float,3ul>(this,(array<float,_3UL> *)local_2c);
  if (bVar1) {
    pvVar2 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,0);
    *(value_type_conflict *)v._M_elems._4_8_ = *pvVar2;
    pvVar2 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,1);
    *(value_type_conflict *)(v._M_elems._4_8_ + 4) = *pvVar2;
    pvVar2 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,2);
    *(value_type_conflict *)(v._M_elems._4_8_ + 8) = *pvVar2;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color3f *value) {
  value::float3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = v[0];
    value->g = v[1];
    value->b = v[2];
    return true;
  }
  return false;
}